

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::SubdivPatch1IntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  int iVar2;
  undefined4 uVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  undefined8 uVar12;
  undefined8 uVar13;
  byte bVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  GridSOA *pGVar22;
  uint uVar23;
  GridSOA *pGVar24;
  ulong *puVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar59;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar60 [32];
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [64];
  undefined1 auVar86 [16];
  undefined1 auVar87 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  GridSOA *local_ab8;
  ulong local_ab0;
  ulong local_aa8;
  undefined1 local_aa0 [16];
  ulong local_a88;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  RTCFilterFunctionNArguments local_a60;
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [32];
  undefined4 local_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c8;
  undefined4 uStack_9c4;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float local_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined8 local_980;
  undefined8 uStack_978;
  undefined1 local_970 [16];
  uint local_960;
  uint uStack_95c;
  uint uStack_958;
  uint uStack_954;
  uint uStack_950;
  uint uStack_94c;
  uint uStack_948;
  uint uStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  GridSOA **local_8e0;
  char local_8d8;
  float local_8c0 [4];
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  float local_820 [4];
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar25 = local_7f8;
  local_800 = root.ptr;
  auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar77 = ZEXT1664(auVar30);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar79 = ZEXT1664(auVar30);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar81 = ZEXT1664(auVar30);
  fVar64 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar59 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar64 * 0.99999964)));
  auVar83 = ZEXT1664(auVar30);
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * 0.99999964)));
  auVar85 = ZEXT1664(auVar30);
  auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar59 * 0.99999964)));
  auVar87 = ZEXT1664(auVar30);
  fVar64 = fVar64 * 1.0000004;
  fVar1 = fVar1 * 1.0000004;
  fVar59 = fVar59 * 1.0000004;
  local_a88 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar27 = local_a88 ^ 0x10;
  iVar2 = (tray->tnear).field_0.i[k];
  auVar30._4_4_ = iVar2;
  auVar30._0_4_ = iVar2;
  auVar30._8_4_ = iVar2;
  auVar30._12_4_ = iVar2;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar68._4_4_ = iVar2;
  auVar68._0_4_ = iVar2;
  auVar68._8_4_ = iVar2;
  auVar68._12_4_ = iVar2;
  local_a10 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  bVar29 = true;
  fVar61 = fVar59;
  fVar62 = fVar59;
  fVar63 = fVar59;
  fVar65 = fVar64;
  fVar66 = fVar64;
  fVar67 = fVar64;
  local_a80 = fVar59;
  fStack_a7c = fVar59;
  fStack_a78 = fVar59;
  fStack_a74 = fVar59;
  local_a70 = fVar64;
  fStack_a6c = fVar64;
  fStack_a68 = fVar64;
  fStack_a64 = fVar64;
  do {
    uVar21 = puVar25[-1];
    puVar25 = puVar25 + -1;
    auVar82 = auVar83._0_16_;
    auVar84 = auVar85._0_16_;
    auVar86 = auVar87._0_16_;
    auVar76 = auVar77._0_16_;
    auVar78 = auVar79._0_16_;
    auVar80 = auVar81._0_16_;
    while ((uVar21 & 8) == 0) {
      auVar31 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar21 + 0x20 + local_a88),auVar76);
      auVar31 = vmulps_avx512vl(auVar82,auVar31);
      auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar26),auVar78);
      auVar32 = vmulps_avx512vl(auVar84,auVar32);
      auVar31 = vmaxps_avx(auVar31,auVar32);
      auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar19),auVar80);
      auVar32 = vmulps_avx512vl(auVar86,auVar32);
      auVar32 = vmaxps_avx(auVar32,auVar30);
      auVar31 = vmaxps_avx(auVar31,auVar32);
      auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar27),auVar76);
      auVar33._0_4_ = fVar64 * auVar32._0_4_;
      auVar33._4_4_ = fVar65 * auVar32._4_4_;
      auVar33._8_4_ = fVar66 * auVar32._8_4_;
      auVar33._12_4_ = fVar67 * auVar32._12_4_;
      auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar26 ^ 0x10)),auVar78);
      auVar55._0_4_ = fVar1 * auVar32._0_4_;
      auVar55._4_4_ = fVar1 * auVar32._4_4_;
      auVar55._8_4_ = fVar1 * auVar32._8_4_;
      auVar55._12_4_ = fVar1 * auVar32._12_4_;
      auVar32 = vminps_avx(auVar33,auVar55);
      auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar19 ^ 0x10)),auVar80);
      auVar56._0_4_ = fVar59 * auVar33._0_4_;
      auVar56._4_4_ = fVar61 * auVar33._4_4_;
      auVar56._8_4_ = fVar62 * auVar33._8_4_;
      auVar56._12_4_ = fVar63 * auVar33._12_4_;
      auVar33 = vminps_avx(auVar56,auVar68);
      auVar32 = vminps_avx(auVar32,auVar33);
      uVar20 = vcmpps_avx512vl(auVar31,auVar32,2);
      if ((char)uVar20 == '\0') goto LAB_006eea42;
      uVar17 = uVar21 & 0xfffffffffffffff0;
      lVar18 = 0;
      for (uVar21 = uVar20; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
        lVar18 = lVar18 + 1;
      }
      uVar21 = *(ulong *)(uVar17 + lVar18 * 8);
      uVar23 = (uint)uVar20 - 1 & (uint)uVar20;
      uVar20 = (ulong)uVar23;
      if (uVar23 != 0) {
        *puVar25 = uVar21;
        lVar18 = 0;
        for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
          lVar18 = lVar18 + 1;
        }
        uVar23 = uVar23 - 1 & uVar23;
        uVar20 = (ulong)uVar23;
        bVar28 = uVar23 == 0;
        while( true ) {
          puVar25 = puVar25 + 1;
          uVar21 = *(ulong *)(uVar17 + lVar18 * 8);
          if (bVar28) break;
          *puVar25 = uVar21;
          lVar18 = 0;
          for (uVar21 = uVar20; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar20 = uVar20 - 1 & uVar20;
          bVar28 = uVar20 == 0;
        }
      }
    }
    if (((uint)uVar21 & 0xf) == 8) {
      pGVar22 = (pre->super_Precalculations).grid;
      uVar23 = *(uint *)(pGVar22 + 0xc);
      local_ab0 = (ulong)uVar23;
      uVar8 = *(uint *)(pGVar22 + 0x10);
      local_aa8 = (ulong)uVar8;
      uVar9 = *(uint *)(pGVar22 + 0x24);
      uVar21 = uVar21 >> 4;
      lVar18 = uVar21 * 4 + (ulong)uVar9;
      auVar31 = *(undefined1 (*) [16])(pGVar22 + local_ab0 * 4 + lVar18 + 0x2c);
      auVar32 = auVar31;
      if (2 < local_aa8) {
        auVar32 = *(undefined1 (*) [16])(pGVar22 + local_ab0 * 8 + uVar21 * 4 + (ulong)uVar9 + 0x2c)
        ;
      }
      auVar33 = *(undefined1 (*) [16])(pGVar22 + uVar21 * 4 + (ulong)uVar9 + 0x2c);
      if (local_ab0 == 2) {
        auVar33 = vshufps_avx(auVar33,auVar33,0x54);
        auVar31 = vshufps_avx(auVar31,auVar31,0x54);
        auVar32 = vshufps_avx(auVar32,auVar32,0x54);
      }
      uVar21 = (ulong)*(uint *)(pGVar22 + 0x14);
      pGVar24 = pGVar22 + uVar21 * 4 + lVar18 + 0x2c;
      auVar55 = *(undefined1 (*) [16])(pGVar24 + local_ab0 * 4);
      auVar56 = auVar55;
      if (2 < uVar8) {
        auVar56 = *(undefined1 (*) [16])(pGVar24 + local_ab0 * 8);
      }
      auVar5 = *(undefined1 (*) [16])pGVar24;
      if (uVar23 == 2) {
        auVar5 = vshufps_avx(auVar5,auVar5,0x54);
        auVar55 = vshufps_avx(auVar55,auVar55,0x54);
        auVar56 = vshufps_avx(auVar56,auVar56,0x54);
      }
      pGVar24 = pGVar22 + uVar21 * 8 + lVar18 + 0x2c;
      auVar6 = *(undefined1 (*) [16])(pGVar24 + local_ab0 * 4);
      auVar69 = auVar6;
      if (2 < uVar8) {
        auVar69 = *(undefined1 (*) [16])(pGVar24 + local_ab0 * 8);
      }
      auVar7 = *(undefined1 (*) [16])pGVar24;
      if (uVar23 == 2) {
        auVar7 = vshufps_avx(auVar7,auVar7,0x54);
        auVar6 = vshufps_avx(auVar6,auVar6,0x54);
        auVar69 = vshufps_avx(auVar69,auVar69,0x54);
      }
      local_ab8 = pGVar22 + uVar21 * 0xc + lVar18 + 0x2c;
      auVar57._16_16_ = auVar31;
      auVar57._0_16_ = auVar33;
      auVar54._16_16_ = auVar32;
      auVar54._0_16_ = auVar31;
      auVar71 = vunpcklps_avx(auVar57,auVar54);
      auVar52 = vshufps_avx(auVar57,auVar57,0xa5);
      auVar36 = vshufps_avx(auVar54,auVar54,0x94);
      auVar38._16_16_ = auVar55;
      auVar38._0_16_ = auVar5;
      auVar37._16_16_ = auVar56;
      auVar37._0_16_ = auVar55;
      auVar54 = vunpcklps_avx(auVar38,auVar37);
      auVar53 = vshufps_avx(auVar38,auVar38,0xa5);
      auVar49 = vshufps_avx(auVar37,auVar37,0x94);
      auVar40._16_16_ = auVar6;
      auVar40._0_16_ = auVar7;
      auVar39._16_16_ = auVar69;
      auVar39._0_16_ = auVar6;
      auVar57 = vunpcklps_avx(auVar40,auVar39);
      auVar47 = vshufps_avx(auVar40,auVar40,0xa5);
      uVar3 = *(undefined4 *)(ray + k * 4);
      auVar41._4_4_ = uVar3;
      auVar41._0_4_ = uVar3;
      auVar41._8_4_ = uVar3;
      auVar41._12_4_ = uVar3;
      auVar41._16_4_ = uVar3;
      auVar41._20_4_ = uVar3;
      auVar41._24_4_ = uVar3;
      auVar41._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar42._4_4_ = uVar3;
      auVar42._0_4_ = uVar3;
      auVar42._8_4_ = uVar3;
      auVar42._12_4_ = uVar3;
      auVar42._16_4_ = uVar3;
      auVar42._20_4_ = uVar3;
      auVar42._24_4_ = uVar3;
      auVar42._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar43._4_4_ = uVar3;
      auVar43._0_4_ = uVar3;
      auVar43._8_4_ = uVar3;
      auVar43._12_4_ = uVar3;
      auVar43._16_4_ = uVar3;
      auVar43._20_4_ = uVar3;
      auVar43._24_4_ = uVar3;
      auVar43._28_4_ = uVar3;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar70._4_4_ = uVar3;
      auVar70._0_4_ = uVar3;
      auVar70._8_4_ = uVar3;
      auVar70._12_4_ = uVar3;
      auVar70._16_4_ = uVar3;
      auVar70._20_4_ = uVar3;
      auVar70._24_4_ = uVar3;
      auVar70._28_4_ = uVar3;
      auVar34 = vshufps_avx512vl(auVar39,auVar39,0x94);
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x50);
      auVar73._4_4_ = uVar3;
      auVar73._0_4_ = uVar3;
      auVar73._8_4_ = uVar3;
      auVar73._12_4_ = uVar3;
      auVar73._16_4_ = uVar3;
      auVar73._20_4_ = uVar3;
      auVar73._24_4_ = uVar3;
      auVar73._28_4_ = uVar3;
      fVar4 = *(float *)(ray + k * 4 + 0x60);
      auVar74._4_4_ = fVar4;
      auVar74._0_4_ = fVar4;
      auVar74._8_4_ = fVar4;
      auVar74._12_4_ = fVar4;
      auVar74._16_4_ = fVar4;
      auVar74._20_4_ = fVar4;
      auVar74._24_4_ = fVar4;
      auVar74._28_4_ = fVar4;
      auVar71 = vsubps_avx(auVar71,auVar41);
      auVar54 = vsubps_avx(auVar54,auVar42);
      auVar57 = vsubps_avx(auVar57,auVar43);
      auVar52 = vsubps_avx(auVar52,auVar41);
      auVar35 = vsubps_avx512vl(auVar53,auVar42);
      auVar53 = vsubps_avx(auVar47,auVar43);
      auVar36 = vsubps_avx512vl(auVar36,auVar41);
      auVar37 = vsubps_avx512vl(auVar49,auVar42);
      auVar34 = vsubps_avx512vl(auVar34,auVar43);
      auVar38 = vsubps_avx512vl(auVar36,auVar71);
      auVar39 = vsubps_avx512vl(auVar37,auVar54);
      auVar40 = vsubps_avx512vl(auVar34,auVar57);
      auVar41 = vsubps_avx512vl(auVar71,auVar52);
      auVar42 = vsubps_avx512vl(auVar54,auVar35);
      auVar43 = vsubps_avx512vl(auVar57,auVar53);
      auVar44 = vsubps_avx512vl(auVar52,auVar36);
      auVar45 = vsubps_avx512vl(auVar35,auVar37);
      auVar46 = vsubps_avx512vl(auVar53,auVar34);
      auVar47 = vaddps_avx512vl(auVar36,auVar71);
      auVar48 = vaddps_avx512vl(auVar37,auVar54);
      auVar49 = vaddps_avx512vl(auVar34,auVar57);
      auVar50 = vmulps_avx512vl(auVar48,auVar40);
      auVar50 = vfmsub231ps_avx512vl(auVar50,auVar39,auVar49);
      auVar49 = vmulps_avx512vl(auVar49,auVar38);
      auVar51 = vfmsub231ps_avx512vl(auVar49,auVar40,auVar47);
      auVar49._4_4_ = auVar39._4_4_ * auVar47._4_4_;
      auVar49._0_4_ = auVar39._0_4_ * auVar47._0_4_;
      auVar49._8_4_ = auVar39._8_4_ * auVar47._8_4_;
      auVar49._12_4_ = auVar39._12_4_ * auVar47._12_4_;
      auVar49._16_4_ = auVar39._16_4_ * auVar47._16_4_;
      auVar49._20_4_ = auVar39._20_4_ * auVar47._20_4_;
      auVar49._24_4_ = auVar39._24_4_ * auVar47._24_4_;
      auVar49._28_4_ = auVar47._28_4_;
      auVar31 = vfmsub231ps_fma(auVar49,auVar38,auVar48);
      auVar48._0_4_ = fVar4 * auVar31._0_4_;
      auVar48._4_4_ = fVar4 * auVar31._4_4_;
      auVar48._8_4_ = fVar4 * auVar31._8_4_;
      auVar48._12_4_ = fVar4 * auVar31._12_4_;
      auVar48._16_4_ = fVar4 * 0.0;
      auVar48._20_4_ = fVar4 * 0.0;
      auVar48._24_4_ = fVar4 * 0.0;
      auVar48._28_4_ = 0;
      auVar49 = vfmadd231ps_avx512vl(auVar48,auVar73,auVar51);
      local_940 = vfmadd231ps_avx512vl(auVar49,auVar70,auVar50);
      auVar51._0_4_ = auVar71._0_4_ + auVar52._0_4_;
      auVar51._4_4_ = auVar71._4_4_ + auVar52._4_4_;
      auVar51._8_4_ = auVar71._8_4_ + auVar52._8_4_;
      auVar51._12_4_ = auVar71._12_4_ + auVar52._12_4_;
      auVar51._16_4_ = auVar71._16_4_ + auVar52._16_4_;
      auVar51._20_4_ = auVar71._20_4_ + auVar52._20_4_;
      auVar51._24_4_ = auVar71._24_4_ + auVar52._24_4_;
      auVar51._28_4_ = auVar71._28_4_ + auVar52._28_4_;
      auVar49 = vaddps_avx512vl(auVar54,auVar35);
      auVar47 = vaddps_avx512vl(auVar57,auVar53);
      auVar48 = vmulps_avx512vl(auVar49,auVar43);
      auVar48 = vfmsub231ps_avx512vl(auVar48,auVar42,auVar47);
      auVar47 = vmulps_avx512vl(auVar47,auVar41);
      auVar50 = vfmsub231ps_avx512vl(auVar47,auVar43,auVar51);
      auVar47 = vmulps_avx512vl(auVar51,auVar42);
      auVar49 = vfmsub231ps_avx512vl(auVar47,auVar41,auVar49);
      auVar47._4_4_ = fVar4 * auVar49._4_4_;
      auVar47._0_4_ = fVar4 * auVar49._0_4_;
      auVar47._8_4_ = fVar4 * auVar49._8_4_;
      auVar47._12_4_ = fVar4 * auVar49._12_4_;
      auVar47._16_4_ = fVar4 * auVar49._16_4_;
      auVar47._20_4_ = fVar4 * auVar49._20_4_;
      auVar47._24_4_ = fVar4 * auVar49._24_4_;
      auVar47._28_4_ = auVar49._28_4_;
      auVar49 = vfmadd231ps_avx512vl(auVar47,auVar73,auVar50);
      local_920 = vfmadd231ps_avx512vl(auVar49,auVar70,auVar48);
      auVar52 = vaddps_avx512vl(auVar52,auVar36);
      auVar36 = vaddps_avx512vl(auVar35,auVar37);
      auVar49 = vaddps_avx512vl(auVar53,auVar34);
      auVar53 = vmulps_avx512vl(auVar36,auVar46);
      auVar47 = vfmsub231ps_avx512vl(auVar53,auVar45,auVar49);
      auVar53._4_4_ = auVar49._4_4_ * auVar44._4_4_;
      auVar53._0_4_ = auVar49._0_4_ * auVar44._0_4_;
      auVar53._8_4_ = auVar49._8_4_ * auVar44._8_4_;
      auVar53._12_4_ = auVar49._12_4_ * auVar44._12_4_;
      auVar53._16_4_ = auVar49._16_4_ * auVar44._16_4_;
      auVar53._20_4_ = auVar49._20_4_ * auVar44._20_4_;
      auVar53._24_4_ = auVar49._24_4_ * auVar44._24_4_;
      auVar53._28_4_ = auVar49._28_4_;
      auVar31 = vfmsub231ps_fma(auVar53,auVar46,auVar52);
      auVar34._4_4_ = auVar52._4_4_ * auVar45._4_4_;
      auVar34._0_4_ = auVar52._0_4_ * auVar45._0_4_;
      auVar34._8_4_ = auVar52._8_4_ * auVar45._8_4_;
      auVar34._12_4_ = auVar52._12_4_ * auVar45._12_4_;
      auVar34._16_4_ = auVar52._16_4_ * auVar45._16_4_;
      auVar34._20_4_ = auVar52._20_4_ * auVar45._20_4_;
      auVar34._24_4_ = auVar52._24_4_ * auVar45._24_4_;
      auVar34._28_4_ = auVar52._28_4_;
      auVar52 = vfmsub231ps_avx512vl(auVar34,auVar44,auVar36);
      auVar52 = vmulps_avx512vl(auVar52,auVar74);
      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar73,ZEXT1632(auVar31));
      auVar53 = vfmadd231ps_avx512vl(auVar52,auVar70,auVar47);
      auVar35._0_4_ = local_940._0_4_ + local_920._0_4_;
      auVar35._4_4_ = local_940._4_4_ + local_920._4_4_;
      auVar35._8_4_ = local_940._8_4_ + local_920._8_4_;
      auVar35._12_4_ = local_940._12_4_ + local_920._12_4_;
      auVar35._16_4_ = local_940._16_4_ + local_920._16_4_;
      auVar35._20_4_ = local_940._20_4_ + local_920._20_4_;
      auVar35._24_4_ = local_940._24_4_ + local_920._24_4_;
      auVar35._28_4_ = local_940._28_4_ + local_920._28_4_;
      local_900 = vaddps_avx512vl(auVar53,auVar35);
      auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_900,auVar49);
      auVar52._8_4_ = 0x34000000;
      auVar52._0_8_ = 0x3400000034000000;
      auVar52._12_4_ = 0x34000000;
      auVar52._16_4_ = 0x34000000;
      auVar52._20_4_ = 0x34000000;
      auVar52._24_4_ = 0x34000000;
      auVar52._28_4_ = 0x34000000;
      auVar52 = vmulps_avx512vl(auVar49,auVar52);
      auVar36 = vminps_avx512vl(local_940,local_920);
      auVar47 = vminps_avx512vl(auVar36,auVar53);
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar36._16_4_ = 0x80000000;
      auVar36._20_4_ = 0x80000000;
      auVar36._24_4_ = 0x80000000;
      auVar36._28_4_ = 0x80000000;
      auVar36 = vxorps_avx512vl(auVar52,auVar36);
      uVar12 = vcmpps_avx512vl(auVar47,auVar36,5);
      auVar36 = vmaxps_avx512vl(local_940,local_920);
      auVar36 = vmaxps_avx512vl(auVar36,auVar53);
      uVar13 = vcmpps_avx512vl(auVar36,auVar52,2);
      bVar14 = (byte)uVar12 | (byte)uVar13;
      fVar59 = local_a80;
      fVar61 = fStack_a7c;
      fVar62 = fStack_a78;
      fVar63 = fStack_a74;
      fVar64 = local_a70;
      fVar65 = fStack_a6c;
      fVar66 = fStack_a68;
      fVar67 = fStack_a64;
      if (bVar14 != 0) {
        auVar52 = vmulps_avx512vl(auVar42,auVar40);
        auVar36 = vmulps_avx512vl(auVar38,auVar43);
        auVar53 = vmulps_avx512vl(auVar41,auVar39);
        auVar47 = vmulps_avx512vl(auVar45,auVar43);
        auVar34 = vmulps_avx512vl(auVar41,auVar46);
        auVar35 = vmulps_avx512vl(auVar44,auVar42);
        auVar37 = vfmsub213ps_avx512vl(auVar39,auVar43,auVar52);
        auVar39 = vfmsub213ps_avx512vl(auVar40,auVar41,auVar36);
        auVar38 = vfmsub213ps_avx512vl(auVar38,auVar42,auVar53);
        auVar40 = vfmsub213ps_avx512vl(auVar46,auVar42,auVar47);
        auVar42 = vfmsub213ps_avx512vl(auVar44,auVar43,auVar34);
        auVar41 = vfmsub213ps_avx512vl(auVar45,auVar41,auVar35);
        vandps_avx512vl(auVar52,auVar49);
        vandps_avx512vl(auVar47,auVar49);
        uVar21 = vcmpps_avx512vl(auVar41,auVar41,1);
        vandps_avx512vl(auVar36,auVar49);
        vandps_avx512vl(auVar34,auVar49);
        uVar20 = vcmpps_avx512vl(auVar41,auVar41,1);
        vandps_avx512vl(auVar53,auVar49);
        vandps_avx512vl(auVar35,auVar49);
        uVar17 = vcmpps_avx512vl(auVar41,auVar41,1);
        bVar28 = (bool)((byte)uVar21 & 1);
        local_860._0_4_ = (uint)bVar28 * auVar37._0_4_ | (uint)!bVar28 * auVar40._0_4_;
        bVar28 = (bool)((byte)(uVar21 >> 1) & 1);
        local_860._4_4_ = (uint)bVar28 * auVar37._4_4_ | (uint)!bVar28 * auVar40._4_4_;
        bVar28 = (bool)((byte)(uVar21 >> 2) & 1);
        local_860._8_4_ = (uint)bVar28 * auVar37._8_4_ | (uint)!bVar28 * auVar40._8_4_;
        bVar28 = (bool)((byte)(uVar21 >> 3) & 1);
        local_860._12_4_ = (uint)bVar28 * auVar37._12_4_ | (uint)!bVar28 * auVar40._12_4_;
        bVar28 = (bool)((byte)(uVar21 >> 4) & 1);
        local_860._16_4_ = (uint)bVar28 * auVar37._16_4_ | (uint)!bVar28 * auVar40._16_4_;
        bVar28 = (bool)((byte)(uVar21 >> 5) & 1);
        local_860._20_4_ = (uint)bVar28 * auVar37._20_4_ | (uint)!bVar28 * auVar40._20_4_;
        bVar28 = (bool)((byte)(uVar21 >> 6) & 1);
        local_860._24_4_ = (uint)bVar28 * auVar37._24_4_ | (uint)!bVar28 * auVar40._24_4_;
        bVar28 = SUB81(uVar21 >> 7,0);
        local_860._28_4_ = (uint)bVar28 * auVar37._28_4_ | (uint)!bVar28 * auVar40._28_4_;
        bVar28 = (bool)((byte)uVar20 & 1);
        local_840._0_4_ = (uint)bVar28 * auVar39._0_4_ | (uint)!bVar28 * auVar42._0_4_;
        bVar28 = (bool)((byte)(uVar20 >> 1) & 1);
        local_840._4_4_ = (uint)bVar28 * auVar39._4_4_ | (uint)!bVar28 * auVar42._4_4_;
        bVar28 = (bool)((byte)(uVar20 >> 2) & 1);
        local_840._8_4_ = (uint)bVar28 * auVar39._8_4_ | (uint)!bVar28 * auVar42._8_4_;
        bVar28 = (bool)((byte)(uVar20 >> 3) & 1);
        local_840._12_4_ = (uint)bVar28 * auVar39._12_4_ | (uint)!bVar28 * auVar42._12_4_;
        bVar28 = (bool)((byte)(uVar20 >> 4) & 1);
        local_840._16_4_ = (uint)bVar28 * auVar39._16_4_ | (uint)!bVar28 * auVar42._16_4_;
        bVar28 = (bool)((byte)(uVar20 >> 5) & 1);
        local_840._20_4_ = (uint)bVar28 * auVar39._20_4_ | (uint)!bVar28 * auVar42._20_4_;
        bVar28 = (bool)((byte)(uVar20 >> 6) & 1);
        local_840._24_4_ = (uint)bVar28 * auVar39._24_4_ | (uint)!bVar28 * auVar42._24_4_;
        bVar28 = SUB81(uVar20 >> 7,0);
        local_840._28_4_ = (uint)bVar28 * auVar39._28_4_ | (uint)!bVar28 * auVar42._28_4_;
        bVar28 = (bool)((byte)uVar17 & 1);
        local_820[0] = (float)((uint)bVar28 * auVar38._0_4_ | (uint)!bVar28 * auVar41._0_4_);
        bVar28 = (bool)((byte)(uVar17 >> 1) & 1);
        local_820[1] = (float)((uint)bVar28 * auVar38._4_4_ | (uint)!bVar28 * auVar41._4_4_);
        bVar28 = (bool)((byte)(uVar17 >> 2) & 1);
        local_820[2] = (float)((uint)bVar28 * auVar38._8_4_ | (uint)!bVar28 * auVar41._8_4_);
        bVar28 = (bool)((byte)(uVar17 >> 3) & 1);
        local_820[3] = (float)((uint)bVar28 * auVar38._12_4_ | (uint)!bVar28 * auVar41._12_4_);
        bVar28 = (bool)((byte)(uVar17 >> 4) & 1);
        fStack_810 = (float)((uint)bVar28 * auVar38._16_4_ | (uint)!bVar28 * auVar41._16_4_);
        bVar28 = (bool)((byte)(uVar17 >> 5) & 1);
        fStack_80c = (float)((uint)bVar28 * auVar38._20_4_ | (uint)!bVar28 * auVar41._20_4_);
        bVar28 = (bool)((byte)(uVar17 >> 6) & 1);
        fStack_808 = (float)((uint)bVar28 * auVar38._24_4_ | (uint)!bVar28 * auVar41._24_4_);
        bVar28 = SUB81(uVar17 >> 7,0);
        auVar45._4_4_ = fVar4 * local_820[1];
        auVar45._0_4_ = fVar4 * local_820[0];
        auVar45._8_4_ = fVar4 * local_820[2];
        auVar45._12_4_ = fVar4 * local_820[3];
        auVar45._16_4_ = fVar4 * fStack_810;
        auVar45._20_4_ = fVar4 * fStack_80c;
        auVar45._24_4_ = fVar4 * fStack_808;
        auVar45._28_4_ = fVar4;
        auVar31 = vfmadd213ps_fma(auVar73,local_840,auVar45);
        auVar31 = vfmadd213ps_fma(auVar70,local_860,ZEXT1632(auVar31));
        auVar53 = ZEXT1632(CONCAT412(auVar31._12_4_ + auVar31._12_4_,
                                     CONCAT48(auVar31._8_4_ + auVar31._8_4_,
                                              CONCAT44(auVar31._4_4_ + auVar31._4_4_,
                                                       auVar31._0_4_ + auVar31._0_4_))));
        auVar46._0_4_ = auVar57._0_4_ * local_820[0];
        auVar46._4_4_ = auVar57._4_4_ * local_820[1];
        auVar46._8_4_ = auVar57._8_4_ * local_820[2];
        auVar46._12_4_ = auVar57._12_4_ * local_820[3];
        auVar46._16_4_ = auVar57._16_4_ * fStack_810;
        auVar46._20_4_ = auVar57._20_4_ * fStack_80c;
        auVar46._24_4_ = auVar57._24_4_ * fStack_808;
        auVar46._28_4_ = 0;
        auVar31 = vfmadd213ps_fma(auVar54,local_840,auVar46);
        auVar32 = vfmadd213ps_fma(auVar71,local_860,ZEXT1632(auVar31));
        auVar52 = vrcp14ps_avx512vl(auVar53);
        auVar71._8_4_ = 0x3f800000;
        auVar71._0_8_ = 0x3f8000003f800000;
        auVar71._12_4_ = 0x3f800000;
        auVar71._16_4_ = 0x3f800000;
        auVar71._20_4_ = 0x3f800000;
        auVar71._24_4_ = 0x3f800000;
        auVar71._28_4_ = 0x3f800000;
        auVar36 = vfnmadd213ps_avx512vl(auVar52,auVar53,auVar71);
        auVar31 = vfmadd132ps_fma(auVar36,auVar52,auVar52);
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_a00._4_4_ = uVar3;
        local_a00._0_4_ = uVar3;
        local_a00._8_4_ = uVar3;
        local_a00._12_4_ = uVar3;
        local_a00._16_4_ = uVar3;
        local_a00._20_4_ = uVar3;
        local_a00._24_4_ = uVar3;
        local_a00._28_4_ = uVar3;
        auVar75 = ZEXT3264(local_a00);
        local_880 = ZEXT1632(CONCAT412(auVar31._12_4_ * (auVar32._12_4_ + auVar32._12_4_),
                                       CONCAT48(auVar31._8_4_ * (auVar32._8_4_ + auVar32._8_4_),
                                                CONCAT44(auVar31._4_4_ *
                                                         (auVar32._4_4_ + auVar32._4_4_),
                                                         auVar31._0_4_ *
                                                         (auVar32._0_4_ + auVar32._0_4_)))));
        uVar12 = vcmpps_avx512vl(local_880,local_a00,2);
        uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar44._4_4_ = uVar3;
        auVar44._0_4_ = uVar3;
        auVar44._8_4_ = uVar3;
        auVar44._12_4_ = uVar3;
        auVar44._16_4_ = uVar3;
        auVar44._20_4_ = uVar3;
        auVar44._24_4_ = uVar3;
        auVar44._28_4_ = uVar3;
        uVar13 = vcmpps_avx512vl(local_880,auVar44,0xd);
        bVar14 = (byte)uVar12 & (byte)uVar13 & bVar14;
        if (bVar14 != 0) {
          uVar21 = vcmpps_avx512vl(auVar53,ZEXT832(0) << 0x20,4);
          uVar21 = bVar14 & uVar21;
          local_8d8 = (char)uVar21;
          if (local_8d8 != '\0') {
            local_8e0 = &local_ab8;
            uStack_804 = (uint)bVar28 * auVar38._28_4_ | (uint)!bVar28 * auVar41._28_4_;
            pGVar10 = (context->scene->geometries).items[*(uint *)(pGVar22 + 0x18)].ptr;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_006eeace:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar29;
              }
              auVar50._8_4_ = 0x219392ef;
              auVar50._0_8_ = 0x219392ef219392ef;
              auVar50._12_4_ = 0x219392ef;
              auVar50._16_4_ = 0x219392ef;
              auVar50._20_4_ = 0x219392ef;
              auVar50._24_4_ = 0x219392ef;
              auVar50._28_4_ = 0x219392ef;
              uVar20 = vcmpps_avx512vl(auVar49,auVar50,5);
              auVar31 = *(undefined1 (*) [16])(local_ab8 + local_ab0 * 4);
              auVar32 = auVar31;
              if (2 < local_aa8) {
                auVar32 = *(undefined1 (*) [16])(local_ab8 + local_ab0 * 8);
              }
              auVar33 = *(undefined1 (*) [16])local_ab8;
              if (local_ab0 == 2) {
                auVar33 = vpshufd_avx(auVar33,0x54);
                auVar31 = vpshufd_avx(auVar31,0x54);
                auVar32 = vpshufd_avx(auVar32,0x54);
              }
              auVar52 = vrcp14ps_avx512vl(local_900);
              auVar72._8_4_ = 0x3f800000;
              auVar72._0_8_ = 0x3f8000003f800000;
              auVar72._12_4_ = 0x3f800000;
              auVar72._16_4_ = 0x3f800000;
              auVar72._20_4_ = 0x3f800000;
              auVar72._24_4_ = 0x3f800000;
              auVar72._28_4_ = 0x3f800000;
              auVar55 = vfnmadd213ps_fma(local_900,auVar52,auVar72);
              auVar52 = vfmadd132ps_avx512vl(ZEXT1632(auVar55),auVar52,auVar52);
              fVar63 = (float)((uint)((byte)uVar20 & 1) * auVar52._0_4_);
              fVar64 = (float)((uint)((byte)(uVar20 >> 1) & 1) * auVar52._4_4_);
              fVar59 = (float)((uint)((byte)(uVar20 >> 2) & 1) * auVar52._8_4_);
              fVar61 = (float)((uint)((byte)(uVar20 >> 3) & 1) * auVar52._12_4_);
              fVar62 = (float)((uint)((byte)(uVar20 >> 4) & 1) * auVar52._16_4_);
              fVar66 = (float)((uint)((byte)(uVar20 >> 5) & 1) * auVar52._20_4_);
              fVar65 = (float)((uint)((byte)(uVar20 >> 6) & 1) * auVar52._24_4_);
              auVar15._4_4_ = local_940._4_4_ * fVar64;
              auVar15._0_4_ = local_940._0_4_ * fVar63;
              auVar15._8_4_ = local_940._8_4_ * fVar59;
              auVar15._12_4_ = local_940._12_4_ * fVar61;
              auVar15._16_4_ = local_940._16_4_ * fVar62;
              auVar15._20_4_ = local_940._20_4_ * fVar66;
              auVar15._24_4_ = local_940._24_4_ * fVar65;
              auVar15._28_4_ = local_940._28_4_;
              auVar54 = vminps_avx(auVar15,auVar72);
              auVar16._4_4_ = fVar64 * local_920._4_4_;
              auVar16._0_4_ = fVar63 * local_920._0_4_;
              auVar16._8_4_ = fVar59 * local_920._8_4_;
              auVar16._12_4_ = fVar61 * local_920._12_4_;
              auVar16._16_4_ = fVar62 * local_920._16_4_;
              auVar16._20_4_ = fVar66 * local_920._20_4_;
              auVar16._24_4_ = fVar65 * local_920._24_4_;
              auVar16._28_4_ = local_920._28_4_;
              auVar57 = vminps_avx(auVar16,auVar72);
              auVar58._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar33;
              auVar58._16_16_ = ZEXT116(1) * auVar31;
              auVar60._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar31;
              auVar60._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32
              ;
              auVar52 = vpunpckldq_avx2(auVar58,auVar60);
              auVar53 = vpshufd_avx2(auVar58,0xa5);
              auVar47 = vpshufd_avx2(auVar60,0x94);
              auVar36 = vpsrld_avx2(auVar52,0x10);
              auVar52 = vpblendw_avx2(auVar52,ZEXT832(0) << 0x20,0xaa);
              auVar52 = vcvtdq2ps_avx(auVar52);
              auVar36 = vcvtdq2ps_avx(auVar36);
              auVar49 = vpsrld_avx2(auVar53,0x10);
              auVar53 = vpblendw_avx2(auVar53,ZEXT832(0) << 0x20,0xaa);
              auVar53 = vcvtdq2ps_avx(auVar53);
              auVar49 = vcvtdq2ps_avx(auVar49);
              auVar71 = vpsrld_avx2(auVar47,0x10);
              auVar47 = vpblendw_avx2(auVar47,ZEXT832(0) << 0x20,0xaa);
              auVar47 = vcvtdq2ps_avx(auVar47);
              auVar71 = vcvtdq2ps_avx(auVar71);
              auVar34 = vsubps_avx(auVar72,auVar54);
              auVar34 = vsubps_avx(auVar34,auVar57);
              local_8c0[0] = auVar57._0_4_ * auVar47._0_4_ * 0.00012207031 +
                             auVar54._0_4_ * auVar53._0_4_ * 0.00012207031 +
                             auVar34._0_4_ * auVar52._0_4_ * 0.00012207031;
              local_8c0[1] = auVar57._4_4_ * auVar47._4_4_ * 0.00012207031 +
                             auVar54._4_4_ * auVar53._4_4_ * 0.00012207031 +
                             auVar34._4_4_ * auVar52._4_4_ * 0.00012207031;
              local_8c0[2] = auVar57._8_4_ * auVar47._8_4_ * 0.00012207031 +
                             auVar54._8_4_ * auVar53._8_4_ * 0.00012207031 +
                             auVar34._8_4_ * auVar52._8_4_ * 0.00012207031;
              local_8c0[3] = auVar57._12_4_ * auVar47._12_4_ * 0.00012207031 +
                             auVar54._12_4_ * auVar53._12_4_ * 0.00012207031 +
                             auVar34._12_4_ * auVar52._12_4_ * 0.00012207031;
              fStack_8b0 = auVar57._16_4_ * auVar47._16_4_ * 0.00012207031 +
                           auVar54._16_4_ * auVar53._16_4_ * 0.00012207031 +
                           auVar34._16_4_ * auVar52._16_4_ * 0.00012207031;
              fStack_8ac = auVar57._20_4_ * auVar47._20_4_ * 0.00012207031 +
                           auVar54._20_4_ * auVar53._20_4_ * 0.00012207031 +
                           auVar34._20_4_ * auVar52._20_4_ * 0.00012207031;
              fStack_8a8 = auVar57._24_4_ * auVar47._24_4_ * 0.00012207031 +
                           auVar54._24_4_ * auVar53._24_4_ * 0.00012207031 +
                           auVar34._24_4_ * auVar52._24_4_ * 0.00012207031;
              fStack_8a4 = auVar47._28_4_ + auVar53._28_4_ + auVar57._28_4_;
              local_8a0[0] = auVar57._0_4_ * auVar71._0_4_ * 0.00012207031 +
                             auVar54._0_4_ * auVar49._0_4_ * 0.00012207031 +
                             auVar34._0_4_ * auVar36._0_4_ * 0.00012207031;
              local_8a0[1] = auVar57._4_4_ * auVar71._4_4_ * 0.00012207031 +
                             auVar54._4_4_ * auVar49._4_4_ * 0.00012207031 +
                             auVar34._4_4_ * auVar36._4_4_ * 0.00012207031;
              local_8a0[2] = auVar57._8_4_ * auVar71._8_4_ * 0.00012207031 +
                             auVar54._8_4_ * auVar49._8_4_ * 0.00012207031 +
                             auVar34._8_4_ * auVar36._8_4_ * 0.00012207031;
              local_8a0[3] = auVar57._12_4_ * auVar71._12_4_ * 0.00012207031 +
                             auVar54._12_4_ * auVar49._12_4_ * 0.00012207031 +
                             auVar34._12_4_ * auVar36._12_4_ * 0.00012207031;
              fStack_890 = auVar57._16_4_ * auVar71._16_4_ * 0.00012207031 +
                           auVar54._16_4_ * auVar49._16_4_ * 0.00012207031 +
                           auVar34._16_4_ * auVar36._16_4_ * 0.00012207031;
              fStack_88c = auVar57._20_4_ * auVar71._20_4_ * 0.00012207031 +
                           auVar54._20_4_ * auVar49._20_4_ * 0.00012207031 +
                           auVar34._20_4_ * auVar36._20_4_ * 0.00012207031;
              fStack_888 = auVar57._24_4_ * auVar71._24_4_ * 0.00012207031 +
                           auVar54._24_4_ * auVar49._24_4_ * 0.00012207031 +
                           auVar34._24_4_ * auVar36._24_4_ * 0.00012207031;
              fStack_884 = auVar47._28_4_ + auVar49._28_4_ + auVar34._28_4_;
              uVar20 = 0;
              for (uVar17 = uVar21; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
                uVar20 = uVar20 + 1;
              }
              local_a20 = vpbroadcastd_avx512vl();
              local_a30 = vpbroadcastd_avx512vl();
              do {
                fVar64 = local_8c0[uVar20];
                local_9a0._4_4_ = fVar64;
                local_9a0._0_4_ = fVar64;
                local_9a0._8_4_ = fVar64;
                local_9a0._12_4_ = fVar64;
                fVar64 = local_8a0[uVar20];
                local_990._4_4_ = fVar64;
                local_990._0_4_ = fVar64;
                local_990._8_4_ = fVar64;
                local_990._12_4_ = fVar64;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_880 + uVar20 * 4);
                local_a60.context = context->user;
                local_9d0 = *(undefined4 *)(local_860 + uVar20 * 4);
                local_9c0 = local_820[uVar20 - 8];
                local_9b0 = local_820[uVar20];
                local_980 = local_a30._0_8_;
                uStack_978 = local_a30._8_8_;
                local_970 = local_a20;
                vpcmpeqd_avx2(ZEXT1632(local_a20),ZEXT1632(local_a20));
                uStack_95c = (local_a60.context)->instID[0];
                local_960 = uStack_95c;
                uStack_958 = uStack_95c;
                uStack_954 = uStack_95c;
                uStack_950 = (local_a60.context)->instPrimID[0];
                uStack_94c = uStack_950;
                uStack_948 = uStack_950;
                uStack_944 = uStack_950;
                local_aa0 = local_a10;
                local_a60.valid = (int *)local_aa0;
                local_a60.geometryUserPtr = pGVar10->userPtr;
                local_a60.hit = (RTCHitN *)&local_9d0;
                local_a60.N = 4;
                local_a60.ray = (RTCRayN *)ray;
                uStack_9cc = local_9d0;
                uStack_9c8 = local_9d0;
                uStack_9c4 = local_9d0;
                fStack_9bc = local_9c0;
                fStack_9b8 = local_9c0;
                fStack_9b4 = local_9c0;
                fStack_9ac = local_9b0;
                fStack_9a8 = local_9b0;
                fStack_9a4 = local_9b0;
                if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar10->occlusionFilterN)(&local_a60);
                  auVar75 = ZEXT3264(local_a00);
                }
                uVar17 = vptestmd_avx512vl(local_aa0,local_aa0);
                if ((uVar17 & 0xf) != 0) {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var11)(&local_a60);
                    auVar75 = ZEXT3264(local_a00);
                  }
                  uVar17 = vptestmd_avx512vl(local_aa0,local_aa0);
                  uVar17 = uVar17 & 0xf;
                  auVar32 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                  bVar28 = (bool)((byte)uVar17 & 1);
                  auVar31._0_4_ =
                       (uint)bVar28 * auVar32._0_4_ | (uint)!bVar28 * *(int *)(local_a60.ray + 0x80)
                  ;
                  bVar28 = (bool)((byte)(uVar17 >> 1) & 1);
                  auVar31._4_4_ =
                       (uint)bVar28 * auVar32._4_4_ | (uint)!bVar28 * *(int *)(local_a60.ray + 0x84)
                  ;
                  bVar28 = (bool)((byte)(uVar17 >> 2) & 1);
                  auVar31._8_4_ =
                       (uint)bVar28 * auVar32._8_4_ | (uint)!bVar28 * *(int *)(local_a60.ray + 0x88)
                  ;
                  bVar28 = SUB81(uVar17 >> 3,0);
                  auVar31._12_4_ =
                       (uint)bVar28 * auVar32._12_4_ |
                       (uint)!bVar28 * *(int *)(local_a60.ray + 0x8c);
                  *(undefined1 (*) [16])(local_a60.ray + 0x80) = auVar31;
                  if ((byte)uVar17 != 0) goto LAB_006eeace;
                }
                auVar87 = ZEXT1664(auVar86);
                auVar85 = ZEXT1664(auVar84);
                auVar83 = ZEXT1664(auVar82);
                auVar81 = ZEXT1664(auVar80);
                auVar79 = ZEXT1664(auVar78);
                auVar77 = ZEXT1664(auVar76);
                *(int *)(ray + k * 4 + 0x80) = auVar75._0_4_;
                uVar17 = uVar20 & 0x3f;
                uVar20 = 0;
                uVar21 = uVar21 ^ 1L << uVar17;
                for (uVar17 = uVar21; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000)
                {
                  uVar20 = uVar20 + 1;
                }
                fVar59 = local_a80;
                fVar61 = fStack_a7c;
                fVar62 = fStack_a78;
                fVar63 = fStack_a74;
                fVar64 = local_a70;
                fVar65 = fStack_a6c;
                fVar66 = fStack_a68;
                fVar67 = fStack_a64;
              } while (uVar21 != 0);
            }
          }
        }
      }
    }
    else {
      pGVar22 = (GridSOA *)(uVar21 & 0xfffffffffffffff0);
      uVar21 = *(ulong *)(pGVar22 + (ulong)*(uint *)(pGVar22 + 0x2c) + 0x30);
      (pre->super_Precalculations).grid = pGVar22;
      if (uVar21 != 0) {
        *puVar25 = uVar21;
        puVar25 = puVar25 + 1;
      }
    }
LAB_006eea42:
    bVar29 = puVar25 != &local_800;
    if (!bVar29) {
      return bVar29;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }